

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::FillStaticLayerParams::InternalSwap
          (FillStaticLayerParams *this,FillStaticLayerParams *other)

{
  float fVar1;
  int iVar2;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->targetshape_,&other->targetshape_);
  fVar1 = this->value_;
  this->value_ = other->value_;
  other->value_ = fVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void FillStaticLayerParams::InternalSwap(FillStaticLayerParams* other) {
  targetshape_.InternalSwap(&other->targetshape_);
  std::swap(value_, other->value_);
  std::swap(_cached_size_, other->_cached_size_);
}